

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::DatagramReceiver> __thiscall
kj::anon_unknown_30::DatagramPortImpl::makeReceiver(DatagramPortImpl *this,Capacity capacity)

{
  OwnedFileDescriptor OVar1;
  size_t in_RCX;
  DatagramReceiver *extraout_RDX;
  DatagramReceiver *extraout_RDX_00;
  DatagramReceiver *pDVar2;
  Own<kj::DatagramReceiver> OVar3;
  
  OVar1 = (OwnedFileDescriptor)operator_new(0x138);
  *(undefined ***)OVar1 = &PTR_receive_00433748;
  *(size_t *)((long)OVar1 + 8) = capacity.content;
  heapArray<unsigned_char>((Array<unsigned_char> *)((long)OVar1 + 0x10),capacity.ancillary);
  if (in_RCX == 0) {
    ((Array<unsigned_char> *)((long)OVar1 + 0x28))->ptr = (uchar *)0x0;
    *(undefined8 *)((long)OVar1 + 0x30) = 0;
    *(undefined8 *)((long)OVar1 + 0x38) = 0;
    pDVar2 = extraout_RDX;
  }
  else {
    heapArray<unsigned_char>((Array<unsigned_char> *)((long)OVar1 + 0x28),in_RCX);
    pDVar2 = extraout_RDX_00;
  }
  *(undefined8 *)((long)OVar1 + 0x50) = 0;
  *(undefined8 *)((long)OVar1 + 0x40) = 0;
  *(undefined8 *)((long)OVar1 + 0x48) = 0;
  *(undefined8 *)((long)OVar1 + 0x60) = 0;
  *(undefined2 *)((long)OVar1 + 0x68) = 0;
  *(undefined1 *)((long)OVar1 + 0x70) = 0;
  (this->super_DatagramPort)._vptr_DatagramPort =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl>::instance;
  this->super_OwnedFileDescriptor = OVar1;
  OVar3.ptr = pDVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<DatagramReceiver> DatagramPortImpl::makeReceiver(DatagramReceiver::Capacity capacity) {
  return kj::heap<ReceiverImpl>(*this, capacity);
}